

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parquet.cpp
# Opt level: O3

void __thiscall
duckdb::ParquetColumnDefinition::Serialize(ParquetColumnDefinition *this,Serializer *serializer)

{
  LogicalType local_70;
  Value local_58;
  
  Serializer::WritePropertyWithDefault<int>(serializer,100,"field_id",&this->field_id);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,0x65,"name",&this->name);
  Serializer::WriteProperty<duckdb::LogicalType>(serializer,0x67,"type",&this->type);
  Serializer::WriteProperty<duckdb::Value>(serializer,0x68,"default_value",&this->default_value);
  LogicalType::LogicalType(&local_70,SQLNULL);
  Value::Value(&local_58,&local_70);
  Serializer::WritePropertyWithDefault<duckdb::Value>
            (serializer,0x69,"identifier",&this->identifier,&local_58);
  Value::~Value(&local_58);
  LogicalType::~LogicalType(&local_70);
  return;
}

Assistant:

void ParquetColumnDefinition::Serialize(Serializer &serializer) const {
	serializer.WritePropertyWithDefault<int32_t>(100, "field_id", field_id);
	serializer.WritePropertyWithDefault<string>(101, "name", name);
	serializer.WriteProperty<LogicalType>(103, "type", type);
	serializer.WriteProperty<Value>(104, "default_value", default_value);
	serializer.WritePropertyWithDefault<Value>(105, "identifier", identifier, Value());
}